

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::queryTextureLevelState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int level,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<float> local_24;
  
  if (type == QUERY_TEXTURE_LEVEL_FLOAT) {
    local_24.m_preguard = -8.0297587e+18;
    local_24.m_value = -8.0297587e+18;
    local_24.m_postguard = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexLevelParameterfv(gl,target,level,pname,&local_24.m_value);
    bVar1 = checkError(result,gl,"glGetTexLevelParameterfv");
    if (bVar1) {
      bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity(&local_24,result);
      if (bVar1) {
        state->m_type = DATATYPE_FLOAT;
        (state->m_v).vInt = (GLint)local_24.m_value;
      }
    }
  }
  else if (type == QUERY_TEXTURE_LEVEL_INTEGER) {
    local_24.m_preguard = -8.0297587e+18;
    local_24.m_value = -8.0297587e+18;
    local_24.m_postguard = -8.0297587e+18;
    glu::CallLogWrapper::glGetTexLevelParameteriv(gl,target,level,pname,(GLint *)&local_24.m_value);
    bVar1 = checkError(result,gl,"glGetTexLevelParameteriv");
    if (bVar1) {
      bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)&local_24,result);
      if (bVar1) {
        state->m_type = DATATYPE_INTEGER;
        (state->m_v).vInt = (GLint)local_24.m_value;
      }
    }
  }
  return;
}

Assistant:

void queryTextureLevelState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int level, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_TEXTURE_LEVEL_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetTexLevelParameteriv(target, level, pname, &value);

			if (!checkError(result, gl, "glGetTexLevelParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_LEVEL_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetTexLevelParameterfv(target, level, pname, &value);

			if (!checkError(result, gl, "glGetTexLevelParameterfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}